

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  long lVar1;
  real *prVar2;
  real *prVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x3a,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  if (i < A->m_) {
    lVar1 = A->n_;
    if (this->m_ == lVar1) {
      if (0 < lVar1) {
        prVar2 = A->data_;
        prVar3 = this->data_;
        lVar5 = 0;
        do {
          auVar4._4_12_ = in_register_00001204;
          auVar4._0_4_ = a;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)prVar2[i * lVar1 + lVar5]),auVar4,
                                   ZEXT416((uint)prVar3[lVar5]));
          prVar3[lVar5] = auVar4._0_4_;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      return;
    }
    __assert_fail("m_ == A.n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                  ,0x3c,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  __assert_fail("i < A.m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/vector.cc"
                ,0x3b,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.m_);
  assert(m_ == A.n_);
  for (int64_t j = 0; j < A.n_; j++) {
    data_[j] += a * A.data_[i * A.n_ + j];
  }
}